

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

bool __thiscall
boost::ext::ut::v1_1_8::runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16>
::
on<boost::ext::ut::v1_1_8::detail::eq_<double,boost::ext::ut::v1_1_8::detail::integral_constant<1>>>
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16> *this,
          assertion<boost::ext::ut::v1_1_8::detail::eq_<double,_boost::ext::ut::v1_1_8::detail::integral_constant<1>_>_>
          assertion)

{
  assertion_fail<boost::ext::ut::v1_1_8::detail::eq_<double,_boost::ext::ut::v1_1_8::detail::integral_constant<1>_>_>
  assertion_00;
  bool bVar1;
  undefined6 uStack_16;
  undefined4 uStack_4;
  
  bVar1 = true;
  if (this[0x348] ==
      (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16>)0x0) {
    if (assertion.expr.value_ != true) {
      *(long *)(this + 0x210) = *(long *)(this + 0x210) + 1;
      assertion_00.expr._10_6_ = uStack_16;
      assertion_00.expr._8_2_ = assertion.expr._8_2_;
      assertion_00.location._12_4_ = uStack_4;
      assertion_00.location.line_ = assertion.location.line_;
      assertion_00.expr.lhs_ = assertion.expr.lhs_;
      assertion_00.location.file_ = assertion.location.file_;
      reporter<boost::ext::ut::v1_1_8::printer>::
      on<boost::ext::ut::v1_1_8::detail::eq_<double,boost::ext::ut::v1_1_8::detail::integral_constant<1>>>
                ((reporter<boost::ext::ut::v1_1_8::printer> *)this,assertion_00);
    }
    else {
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
    }
    bVar1 = assertion.expr.value_ == true;
  }
  return bVar1;
}

Assistant:

[[nodiscard]] auto on(events::assertion<TExpr> assertion) -> bool {
      if (dry_run_) {
        return true;
      }

      if (static_cast<bool>(assertion.expr)) {
        reporter_.on(events::assertion_pass<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return true;
      } else {
        ++fails_;
        reporter_.on(events::assertion_fail<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return false;
      }
    }